

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrammarResolver.cpp
# Opt level: O3

DatatypeValidator * __thiscall
xercesc_4_0::GrammarResolver::getDatatypeValidator
          (GrammarResolver *this,XMLCh *uriStr,XMLCh *localPartStr)

{
  XMLCh XVar1;
  XMLCh XVar2;
  int iVar3;
  XMLCh *pXVar4;
  Grammar *pGVar5;
  undefined4 extraout_var;
  DatatypeValidatorFactory *this_00;
  DatatypeValidator *pDVar6;
  XMLCh *pXVar7;
  XMLSize_t XVar8;
  XMLBuffer local_58;
  
  if (uriStr != L"http://www.w3.org/2001/XMLSchema") {
    pXVar4 = L"http://www.w3.org/2001/XMLSchema";
    pXVar7 = uriStr;
    if (uriStr == (XMLCh *)0x0) {
LAB_002ea8f8:
      if (*pXVar4 == L'\0') goto LAB_002ea99e;
    }
    else {
      do {
        XVar1 = *pXVar7;
        if (XVar1 == L'\0') goto LAB_002ea8f8;
        XVar2 = *pXVar4;
        pXVar4 = pXVar4 + 1;
        pXVar7 = pXVar7 + 1;
      } while (XVar1 == XVar2);
    }
    pGVar5 = getGrammar(this,uriStr);
    if ((pGVar5 == (Grammar *)0x0) ||
       (iVar3 = (*(pGVar5->super_XSerializable)._vptr_XSerializable[5])(pGVar5), iVar3 != 1)) {
      pDVar6 = (DatatypeValidator *)0x0;
    }
    else {
      local_58.fMemoryManager = this->fMemoryManager;
      local_58.fCapacity = 0x80;
      local_58.fFullSize = 0;
      local_58.fUsed = false;
      local_58.fFullHandler = (XMLBufferFullHandler *)0x0;
      iVar3 = (*(local_58.fMemoryManager)->_vptr_MemoryManager[3])(local_58.fMemoryManager,0x102);
      local_58.fBuffer = (XMLCh *)CONCAT44(extraout_var,iVar3);
      *local_58.fBuffer = L'\0';
      local_58.fIndex = 0;
      XVar8 = 0;
      if (uriStr != (XMLCh *)0x0) {
        if (*uriStr == L'\0') {
          XVar8 = 0;
        }
        else {
          XMLBuffer::append(&local_58,uriStr);
          XVar8 = local_58.fIndex;
          if (local_58.fIndex == local_58.fCapacity) {
            XMLBuffer::ensureCapacity(&local_58,1);
            XVar8 = local_58.fIndex;
          }
        }
      }
      local_58.fIndex = XVar8 + 1;
      local_58.fBuffer[XVar8] = L',';
      XMLBuffer::append(&local_58,localPartStr);
      local_58.fBuffer[local_58.fIndex] = L'\0';
      pDVar6 = DatatypeValidatorFactory::getDatatypeValidator
                         ((DatatypeValidatorFactory *)(pGVar5 + 0xf),local_58.fBuffer);
      (*(local_58.fMemoryManager)->_vptr_MemoryManager[4])(local_58.fMemoryManager,local_58.fBuffer)
      ;
    }
    return pDVar6;
  }
LAB_002ea99e:
  this_00 = this->fDataTypeReg;
  if (this_00 == (DatatypeValidatorFactory *)0x0) {
    this_00 = (DatatypeValidatorFactory *)XMemory::operator_new(0x18,this->fMemoryManager);
    DatatypeValidatorFactory::DatatypeValidatorFactory(this_00,this->fMemoryManager);
    this->fDataTypeReg = this_00;
  }
  pDVar6 = DatatypeValidatorFactory::getDatatypeValidator(this_00,localPartStr);
  return pDVar6;
}

Assistant:

DatatypeValidator*
GrammarResolver::getDatatypeValidator(const XMLCh* const uriStr,
                                      const XMLCh* const localPartStr) {

    DatatypeValidator* dv = 0;

    if (XMLString::equals(uriStr, SchemaSymbols::fgURI_SCHEMAFORSCHEMA)) {

        if (!fDataTypeReg) {

            fDataTypeReg = new (fMemoryManager) DatatypeValidatorFactory(fMemoryManager);
        }

        dv = fDataTypeReg->getDatatypeValidator(localPartStr);
    }
    else {

        Grammar* grammar = getGrammar(uriStr);

        if (grammar && grammar->getGrammarType() == Grammar::SchemaGrammarType) {

            XMLBuffer nameBuf(128, fMemoryManager);

            nameBuf.set(uriStr);
            nameBuf.append(chComma);
            nameBuf.append(localPartStr);

            dv = ((SchemaGrammar*) grammar)->getDatatypeRegistry()->getDatatypeValidator(nameBuf.getRawBuffer());
        }
    }

    return dv;
}